

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

int RSA_set0_multi_prime_params(RSA *r,BIGNUM **primes,BIGNUM **exps,BIGNUM **coeffs,int pnum)

{
  int iVar1;
  stack_st_RSA_PRIME_INFO *psVar2;
  RSA_PRIME_INFO *pRVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int i;
  RSA_PRIME_INFO *pinfo;
  stack_st_RSA_PRIME_INFO *old;
  stack_st_RSA_PRIME_INFO *prime_infos;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  long local_40;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  local_40 = 0;
  if ((((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == 0)) || (in_R8D == 0)) {
    local_4 = 0;
  }
  else {
    psVar2 = sk_RSA_PRIME_INFO_new_reserve
                       ((sk_RSA_PRIME_INFO_compfunc)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
    if (psVar2 == (stack_st_RSA_PRIME_INFO *)0x0) {
      local_4 = 0;
    }
    else {
      if (*(long *)(in_RDI + 0x88) != 0) {
        local_40 = *(long *)(in_RDI + 0x88);
      }
      for (iVar4 = 0; iVar4 < in_R8D; iVar4 = iVar4 + 1) {
        pRVar3 = ossl_rsa_multip_info_new();
        if (pRVar3 == (RSA_PRIME_INFO *)0x0) goto LAB_002beb90;
        if (((*(long *)(in_RSI + (long)iVar4 * 8) == 0) ||
            (*(long *)(in_RDX + (long)iVar4 * 8) == 0)) ||
           (*(long *)(in_RCX + (long)iVar4 * 8) == 0)) {
          ossl_rsa_multip_info_free((RSA_PRIME_INFO *)0x2beaf6);
          goto LAB_002beb90;
        }
        BN_clear_free((BIGNUM *)pRVar3->r);
        BN_clear_free((BIGNUM *)pRVar3->d);
        BN_clear_free((BIGNUM *)pRVar3->t);
        pRVar3->r = *(BIGNUM **)(in_RSI + (long)iVar4 * 8);
        pRVar3->d = *(BIGNUM **)(in_RDX + (long)iVar4 * 8);
        pRVar3->t = *(BIGNUM **)(in_RCX + (long)iVar4 * 8);
        BN_set_flags(pRVar3->r,4);
        BN_set_flags(pRVar3->d,4);
        BN_set_flags(pRVar3->t,4);
        sk_RSA_PRIME_INFO_push
                  ((stack_st_RSA_PRIME_INFO *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                   (RSA_PRIME_INFO *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      *(stack_st_RSA_PRIME_INFO **)(in_RDI + 0x88) = psVar2;
      iVar1 = ossl_rsa_multip_calc_product((RSA *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
      if (iVar1 == 0) {
        *(long *)(in_RDI + 0x88) = local_40;
LAB_002beb90:
        sk_RSA_PRIME_INFO_pop_free
                  ((stack_st_RSA_PRIME_INFO *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                   (sk_RSA_PRIME_INFO_freefunc)
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        local_4 = 0;
      }
      else {
        if (local_40 != 0) {
          sk_RSA_PRIME_INFO_pop_free
                    ((stack_st_RSA_PRIME_INFO *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                     (sk_RSA_PRIME_INFO_freefunc)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        }
        *(undefined4 *)(in_RDI + 0x10) = 1;
        *(int *)(in_RDI + 0xd8) = *(int *)(in_RDI + 0xd8) + 1;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int RSA_set0_multi_prime_params(RSA *r, BIGNUM *primes[], BIGNUM *exps[],
                                BIGNUM *coeffs[], int pnum)
{
    STACK_OF(RSA_PRIME_INFO) *prime_infos, *old = NULL;
    RSA_PRIME_INFO *pinfo;
    int i;

    if (primes == NULL || exps == NULL || coeffs == NULL || pnum == 0)
        return 0;

    prime_infos = sk_RSA_PRIME_INFO_new_reserve(NULL, pnum);
    if (prime_infos == NULL)
        return 0;

    if (r->prime_infos != NULL)
        old = r->prime_infos;

    for (i = 0; i < pnum; i++) {
        pinfo = ossl_rsa_multip_info_new();
        if (pinfo == NULL)
            goto err;
        if (primes[i] != NULL && exps[i] != NULL && coeffs[i] != NULL) {
            BN_clear_free(pinfo->r);
            BN_clear_free(pinfo->d);
            BN_clear_free(pinfo->t);
            pinfo->r = primes[i];
            pinfo->d = exps[i];
            pinfo->t = coeffs[i];
            BN_set_flags(pinfo->r, BN_FLG_CONSTTIME);
            BN_set_flags(pinfo->d, BN_FLG_CONSTTIME);
            BN_set_flags(pinfo->t, BN_FLG_CONSTTIME);
        } else {
            ossl_rsa_multip_info_free(pinfo);
            goto err;
        }
        (void)sk_RSA_PRIME_INFO_push(prime_infos, pinfo);
    }

    r->prime_infos = prime_infos;

    if (!ossl_rsa_multip_calc_product(r)) {
        r->prime_infos = old;
        goto err;
    }

    if (old != NULL) {
        /*
         * This is hard to deal with, since the old infos could
         * also be set by this function and r, d, t should not
         * be freed in that case. So currently, stay consistent
         * with other *set0* functions: just free it...
         */
        sk_RSA_PRIME_INFO_pop_free(old, ossl_rsa_multip_info_free);
    }

    r->version = RSA_ASN1_VERSION_MULTI;
    r->dirty_cnt++;

    return 1;
 err:
    /* r, d, t should not be freed */
    sk_RSA_PRIME_INFO_pop_free(prime_infos, ossl_rsa_multip_info_free_ex);
    return 0;
}